

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_constant.cpp
# Opt level: O2

void duckdb::ConstantFillFunction<unsigned_long>
               (ColumnSegment *segment,Vector *result,idx_t start_idx,idx_t count)

{
  data_ptr_t pdVar1;
  unsigned_long uVar2;
  idx_t iVar3;
  
  pdVar1 = result->data;
  uVar2 = NumericStats::GetMin<unsigned_long>(&(segment->stats).statistics);
  for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
    *(unsigned_long *)(pdVar1 + iVar3 * 8 + start_idx * 8) = uVar2;
  }
  return;
}

Assistant:

void ConstantFillFunction(ColumnSegment &segment, Vector &result, idx_t start_idx, idx_t count) {
	auto &nstats = segment.stats.statistics;

	auto data = FlatVector::GetData<T>(result);
	auto constant_value = NumericStats::GetMin<T>(nstats);
	for (idx_t i = 0; i < count; i++) {
		data[start_idx + i] = constant_value;
	}
}